

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

ostream * PyreNet::operator<<(ostream *os,NeuralNet *nn)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference l_00;
  Layer *l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *__range1;
  NeuralNet *nn_local;
  ostream *os_local;
  
  poVar2 = (ostream *)std::ostream::operator<<(os,nn->inputSize);
  std::operator<<(poVar2," ");
  sVar3 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::size(&nn->layers);
  poVar2 = (ostream *)std::ostream::operator<<(os,sVar3);
  std::operator<<(poVar2," ");
  __end1 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::begin(&nn->layers);
  l = (Layer *)std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::end(&nn->layers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
                                *)&l);
    if (!bVar1) break;
    l_00 = __gnu_cxx::
           __normal_iterator<const_PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
           ::operator*(&__end1);
    poVar2 = operator<<(os,l_00);
    std::operator<<(poVar2," ");
    __gnu_cxx::
    __normal_iterator<const_PyreNet::Layer_*,_std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>_>
    ::operator++(&__end1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const NeuralNet& nn) {
        os << nn.inputSize << " ";
        os << nn.layers.size() << " ";
        for (const Layer& l : nn.layers)
            os << l << " ";
        return os;
    }